

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.h
# Opt level: O0

uint16_t * __thiscall
icu_63::Normalizer2Impl::getCompositionsList(Normalizer2Impl *this,uint16_t norm16)

{
  UBool UVar1;
  undefined8 local_28;
  uint16_t norm16_local;
  Normalizer2Impl *this_local;
  
  UVar1 = isDecompYes(this,norm16);
  if (UVar1 == '\0') {
    local_28 = getCompositionsListForComposite(this,norm16);
  }
  else {
    local_28 = getCompositionsListForDecompYes(this,norm16);
  }
  return local_28;
}

Assistant:

const uint16_t *getCompositionsList(uint16_t norm16) const {
        return isDecompYes(norm16) ?
                getCompositionsListForDecompYes(norm16) :
                getCompositionsListForComposite(norm16);
    }